

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O2

void rw::hanimInterpCB(void *vout,void *vin1,void *vin2,float32 t,void *param_5)

{
  float r;
  V3d VVar1;
  Quat QVar2;
  
  r = ((float)t - *(float *)((long)vin1 + 8)) /
      (*(float *)((long)vin2 + 8) - *(float *)((long)vin1 + 8));
  VVar1 = lerp((V3d *)((long)vin1 + 0x1c),(V3d *)((long)vin2 + 0x1c),(float32)r);
  *(long *)((long)vout + 0x20) = VVar1._0_8_;
  *(float32 *)((long)vout + 0x28) = VVar1.z;
  QVar2 = slerp((Quat *)((long)vin1 + 0xc),(Quat *)((long)vin2 + 0xc),(float32)r);
  *(Quat *)((long)vout + 0x10) = QVar2;
  return;
}

Assistant:

static void
hanimInterpCB(void *vout, void *vin1, void *vin2, float32 t, void*)
{
	HAnimInterpFrame *out = (HAnimInterpFrame*)vout;
	HAnimKeyFrame *in1 = (HAnimKeyFrame*)vin1;
	HAnimKeyFrame *in2 = (HAnimKeyFrame*)vin2;
assert(t >= in1->time && t <= in2->time);
	float32 a = (t - in1->time)/(in2->time - in1->time);
	out->t =  lerp(in1->t, in2->t, a);
	out->q = slerp(in1->q, in2->q, a);
}